

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O3

void __thiscall
cab::cab(cab *this,weak_ptr<cab_session> *cab_session,cab_manager *cab_manager,id_type id,
        road_network *rnet)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->_id = id;
  this->_passengers = 0;
  this->_position = D;
  this->_costs = 0;
  this->_rnet = rnet;
  (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_cab_session).super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (cab_session->super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (cab_session->super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->_cab_session).super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  this->_cab_manager = cab_manager;
  return;
}

Assistant:

cab::cab(std::weak_ptr<cab_session> cab_session, cab_manager& cab_manager, id_type id, road_network* rnet) :
    _cab_session(cab_session),
    _cab_manager(&cab_manager),
    _id(id),
    _costs(0),
    _rnet(rnet),
    _position(node_type::D)
{
}